

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_checked_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int checks_x,int checks_y,
          rf_color col1,rf_color col2,rf_color *dst,rf_int dst_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  rf_color rVar3;
  rf_color *prVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  auVar2 = _DAT_00177d60;
  auVar1 = _DAT_00177b60;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      lVar5 = (long)width + -1;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      prVar4 = dst + 1;
      lVar5 = 0;
      auVar8 = auVar8 ^ _DAT_00177b60;
      do {
        if (0 < width) {
          uVar7 = 0;
          auVar9 = auVar2;
          do {
            auVar11 = auVar9 ^ auVar1;
            iVar6 = (int)(lVar5 / (long)checks_y);
            if ((bool)(~(auVar8._4_4_ < auVar11._4_4_ ||
                        auVar8._0_4_ < auVar11._0_4_ && auVar11._4_4_ == auVar8._4_4_) & 1)) {
              rVar3 = col2;
              if (((int)((long)uVar7 / (long)checks_x) + iVar6 & 1U) == 0) {
                rVar3 = col1;
              }
              prVar4[uVar7 - 1] = rVar3;
            }
            if (auVar11._12_4_ <= auVar8._12_4_ &&
                (auVar11._8_4_ <= auVar8._8_4_ || auVar11._12_4_ != auVar8._12_4_)) {
              rVar3 = col2;
              if (((int)((long)(uVar7 + 1) / (long)checks_x) + iVar6 & 1U) == 0) {
                rVar3 = col1;
              }
              prVar4[uVar7] = rVar3;
            }
            uVar7 = uVar7 + 2;
            lVar10 = auVar9._8_8_;
            auVar9._0_8_ = auVar9._0_8_ + 2;
            auVar9._8_8_ = lVar10 + 2;
          } while ((width + 1U & 0xfffffffe) != uVar7);
        }
        lVar5 = lVar5 + 1;
        prVar4 = prVar4 + width;
      } while (lVar5 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_checked_to_buffer(int width, int height, int checks_x, int checks_y, rf_color col1, rf_color col2, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                if ((x / checks_x + y / checks_y) % 2 == 0) dst[y * width + x] = col1;
                else dst[y * width + x] = col2;
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}